

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path,cmMessenger *messenger)

{
  CacheEntry *this_00;
  _Rb_tree_color _Var1;
  uint uVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  cmCacheManager *this_01;
  bool bVar7;
  CacheIterator i_00;
  allocator<char> local_519;
  string currentcwd;
  string checkCacheFile;
  CacheIterator i;
  string cacheFile;
  ofstream checkCache;
  cmGeneratedFileStream fout;
  
  std::__cxx11::string::string((string *)&cacheFile,(string *)path);
  std::__cxx11::string::append((char *)&cacheFile);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&cacheFile,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHE_MAJOR_VERSION",(allocator<char> *)&checkCacheFile)
    ;
    uVar2 = cmVersion::GetMajorVersion();
    std::__cxx11::to_string(&currentcwd,uVar2);
    AddCacheEntry(this,(string *)&checkCache,currentcwd._M_dataplus._M_p,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&currentcwd);
    std::__cxx11::string::~string((string *)&checkCache);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHE_MINOR_VERSION",(allocator<char> *)&checkCacheFile)
    ;
    uVar2 = cmVersion::GetMinorVersion();
    std::__cxx11::to_string(&currentcwd,uVar2);
    AddCacheEntry(this,(string *)&checkCache,currentcwd._M_dataplus._M_p,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&currentcwd);
    std::__cxx11::string::~string((string *)&checkCache);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHE_PATCH_VERSION",(allocator<char> *)&checkCacheFile)
    ;
    uVar2 = cmVersion::GetPatchVersion();
    std::__cxx11::to_string(&currentcwd,uVar2);
    AddCacheEntry(this,(string *)&checkCache,currentcwd._M_dataplus._M_p,
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&currentcwd);
    std::__cxx11::string::~string((string *)&checkCache);
    std::__cxx11::string::string((string *)&currentcwd,(string *)path);
    if (((byte)(*currentcwd._M_dataplus._M_p + 0xbfU) < 0x1a) &&
       (currentcwd._M_dataplus._M_p[1] == ':')) {
      *currentcwd._M_dataplus._M_p = *currentcwd._M_dataplus._M_p | 0x20;
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&currentcwd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHEFILE_DIR",(allocator<char> *)&checkCacheFile);
    AddCacheEntry(this,(string *)&checkCache,currentcwd._M_dataplus._M_p,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    std::__cxx11::string::~string((string *)&checkCache);
    poVar3 = std::operator<<((ostream *)&fout,"# This is the CMakeCache file.\n");
    poVar3 = std::operator<<(poVar3,"# For build in directory: ");
    poVar3 = std::operator<<(poVar3,(string *)&currentcwd);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"# It was generated by CMake: ");
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&fout,
                             "# You can edit this file to change values found and used by cmake.");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,
                             "# If you do not want to change any of the values, simply exit the editor."
                            );
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,
                             "# If you do want to change a value, simply edit, save, and exit the editor."
                            );
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"# The syntax for the file is as follows:\n");
    poVar3 = std::operator<<(poVar3,"# KEY:TYPE=VALUE\n");
    poVar3 = std::operator<<(poVar3,"# KEY is the name of a variable in the cache.\n");
    poVar3 = std::operator<<(poVar3,
                             "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<(poVar3,"# VALUE is the current value for the KEY.\n\n");
    std::operator<<((ostream *)&fout,"########################\n");
    std::operator<<((ostream *)&fout,"# EXTERNAL cache entries\n");
    std::operator<<((ostream *)&fout,"########################\n");
    std::operator<<((ostream *)&fout,"\n");
    for (p_Var6 = (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->Cache)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      _Var1 = p_Var6[3]._M_color;
      if ((_Var1 != 4 & *(byte *)&p_Var6[4]._M_right) == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&checkCache,"HELPSTRING",(allocator<char> *)&checkCacheFile);
        this_00 = (CacheEntry *)(p_Var6 + 2);
        pcVar5 = CacheEntry::GetProperty(this_00,(string *)&checkCache);
        std::__cxx11::string::~string((string *)&checkCache);
        if (pcVar5 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&checkCache,"Missing description",(allocator<char> *)&checkCacheFile)
          ;
          OutputHelpString((ostream *)&fout,(string *)&checkCache);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&checkCache,pcVar5,(allocator<char> *)&checkCacheFile);
          OutputHelpString((ostream *)&fout,(string *)&checkCache);
        }
        std::__cxx11::string::~string((string *)&checkCache);
        OutputKey((ostream *)&fout,(string *)(p_Var6 + 1));
        poVar3 = std::operator<<((ostream *)&fout,":");
        pcVar5 = cmState::CacheEntryTypeToString(_Var1);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::operator<<(poVar3,"=");
        OutputValue((ostream *)&fout,(string *)this_00);
        std::operator<<((ostream *)&fout,"\n");
        OutputNewlineTruncationWarning
                  ((ostream *)&fout,(string *)(p_Var6 + 1),(string *)this_00,messenger);
        std::operator<<((ostream *)&fout,"\n");
      }
    }
    std::operator<<((ostream *)&fout,"\n");
    std::operator<<((ostream *)&fout,"########################\n");
    std::operator<<((ostream *)&fout,"# INTERNAL cache entries\n");
    std::operator<<((ostream *)&fout,"########################\n");
    this_01 = (cmCacheManager *)&fout;
    std::operator<<((ostream *)this_01,"\n");
    i.Position._M_node = (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    i.Container = this;
    while ((_Rb_tree_header *)i.Position._M_node !=
           &((i.Container)->Cache)._M_t._M_impl.super__Rb_tree_header) {
      if (*(char *)&i.Position._M_node[4]._M_right == '\x01') {
        _Var1 = i.Position._M_node[3]._M_color;
        i_00.Position._M_node = i.Position._M_node;
        i_00.Container = i.Container;
        WritePropertyEntries(this_01,(ostream *)&fout,i_00,messenger);
        if (_Var1 == 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&checkCache,"HELPSTRING",(allocator<char> *)&checkCacheFile);
          pcVar5 = CacheIterator::GetProperty(&i,(string *)&checkCache);
          std::__cxx11::string::~string((string *)&checkCache);
          if (pcVar5 != (char *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&checkCache,pcVar5,(allocator<char> *)&checkCacheFile);
            OutputHelpString((ostream *)&fout,(string *)&checkCache);
            std::__cxx11::string::~string((string *)&checkCache);
          }
          std::__cxx11::string::string((string *)&checkCache,(string *)(i.Position._M_node + 1));
          OutputKey((ostream *)&fout,(string *)&checkCache);
          std::__cxx11::string::~string((string *)&checkCache);
          poVar3 = std::operator<<((ostream *)&fout,":");
          pcVar5 = cmState::CacheEntryTypeToString(INTERNAL);
          poVar3 = std::operator<<(poVar3,pcVar5);
          std::operator<<(poVar3,"=");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&checkCache,*(char **)(i.Position._M_node + 2),
                     (allocator<char> *)&checkCacheFile);
          OutputValue((ostream *)&fout,(string *)&checkCache);
          std::__cxx11::string::~string((string *)&checkCache);
          std::operator<<((ostream *)&fout,"\n");
          std::__cxx11::string::string((string *)&checkCache,(string *)(i.Position._M_node + 1));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&checkCacheFile,*(char **)(i.Position._M_node + 2),&local_519);
          OutputNewlineTruncationWarning
                    ((ostream *)&fout,(string *)&checkCache,&checkCacheFile,messenger);
          std::__cxx11::string::~string((string *)&checkCacheFile);
          std::__cxx11::string::~string((string *)&checkCache);
        }
      }
      this_01 = (cmCacheManager *)&i;
      CacheIterator::Next(&i);
    }
    std::operator<<((ostream *)&fout,"\n");
    cmGeneratedFileStream::Close(&fout);
    std::__cxx11::string::string((string *)&checkCacheFile,(string *)path);
    std::__cxx11::string::append((char *)&checkCacheFile);
    cmsys::SystemTools::MakeDirectory(&checkCacheFile,(mode_t *)0x0);
    std::__cxx11::string::append((char *)&checkCacheFile);
    std::ofstream::ofstream(&checkCache,checkCacheFile._M_dataplus._M_p,_S_out);
    bVar7 = ((&checkCache.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)checkCache.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream[-3]] & 5) == 0;
    if (bVar7) {
      std::operator<<(&checkCache.super_basic_ostream<char,_std::char_traits<char>_>,
                      "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                     );
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     "Unable to open check cache file for write. ",&checkCacheFile);
      cmSystemTools::Error((string *)&i);
      std::__cxx11::string::~string((string *)&i);
    }
    std::ofstream::~ofstream(&checkCache);
    std::__cxx11::string::~string((string *)&checkCacheFile);
    std::__cxx11::string::~string((string *)&currentcwd);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&checkCache,
                   "Unable to open cache file for save. ",&cacheFile);
    cmSystemTools::Error((string *)&checkCache);
    std::__cxx11::string::~string((string *)&checkCache);
    cmSystemTools::ReportLastSystemError("");
    bVar7 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&cacheFile);
  return bVar7;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path, cmMessenger* messenger)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  cmGeneratedFileStream fout(cacheFile);
  fout.SetCopyIfDifferent(true);
  if (!fout) {
    cmSystemTools::Error("Unable to open cache file for save. " + cacheFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }
  // before writing the cache, update the version numbers
  // to the
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()).c_str(),
                      "Major version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()).c_str(),
                      "Minor version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()).c_str(),
                      "Patch version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if (currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' && currentcwd[1] == ':') {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
  }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd.c_str(),
                      "This is the directory where this CMakeCache.txt"
                      " was created",
                      cmStateEnums::INTERNAL);

  /* clang-format off */
  fout << "# This is the CMakeCache file.\n"
       << "# For build in directory: " << currentcwd << "\n"
       << "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand() << std::endl;
  /* clang-format on */

  /* clang-format off */
  fout << "# You can edit this file to change values found and used by cmake."
       << std::endl
       << "# If you do not want to change any of the values, simply exit the "
       "editor." << std::endl
       << "# If you do want to change a value, simply edit, save, and exit "
       "the editor." << std::endl
       << "# The syntax for the file is as follows:\n"
       << "# KEY:TYPE=VALUE\n"
       << "# KEY is the name of a variable in the cache.\n"
       << "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT "
       "TYPE!." << std::endl
       << "# VALUE is the current value for the KEY.\n\n";
  /* clang-format on */

  fout << "########################\n";
  fout << "# EXTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (auto const& i : this->Cache) {
    CacheEntry const& ce = i.second;
    cmStateEnums::CacheEntryType t = ce.Type;
    if (!ce.Initialized) {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"", (*i).first.c_str(),
                           "\" is uninitialized");
      */
    } else if (t != cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = ce.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, help);
      } else {
        cmCacheManager::OutputHelpString(fout, "Missing description");
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      cmCacheManager::OutputValue(fout, ce.Value);
      fout << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.first, ce.Value,
                                                     messenger);
      fout << "\n";
    }
  }

  fout << "\n";
  fout << "########################\n";
  fout << "# INTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (cmCacheManager::CacheIterator i = this->NewIterator(); !i.IsAtEnd();
       i.Next()) {
    if (!i.Initialized()) {
      continue;
    }

    cmStateEnums::CacheEntryType t = i.GetType();
    this->WritePropertyEntries(fout, i, messenger);
    if (t == cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = i.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, help);
      }
      cmCacheManager::OutputKey(fout, i.GetName());
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      cmCacheManager::OutputValue(fout, i.GetValue());
      fout << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.GetName(),
                                                     i.GetValue(), messenger);
    }
  }
  fout << "\n";
  fout.Close();
  std::string checkCacheFile = path;
  checkCacheFile += "/CMakeFiles";
  cmSystemTools::MakeDirectory(checkCacheFile);
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if (!checkCache) {
    cmSystemTools::Error("Unable to open check cache file for write. " +
                         checkCacheFile);
    return false;
  }
  checkCache << "# This file is generated by cmake for dependency checking "
                "of the CMakeCache.txt file\n";
  return true;
}